

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O2

int MSH::check_read_state(fstream *infile)

{
  ostream *poVar1;
  bool bVar2;
  
  bVar2 = ((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 1) != 0;
  if (bVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Error: Reached bad read state of msh file.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)bVar2;
}

Assistant:

int MSH::check_read_state(std::fstream &infile)
{
    if (infile.bad())
    {
        std::cout << "Error: Reached bad read state of msh file." << std::endl;
        return EXIT_FAILURE;
    }
    else
        return EXIT_SUCCESS;
    return EXIT_FAILURE;
}